

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

PtrTokenOrSyntax * __thiscall
slang::syntax::ExternUdpDeclSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,ExternUdpDeclSyntax *this,size_t index)

{
  __index_type *p_Var1;
  
  switch(this) {
  case (ExternUdpDeclSyntax *)0x0:
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 2);
    break;
  case (ExternUdpDeclSyntax *)0x1:
    return __return_storage_ptr__ + 5;
  case (ExternUdpDeclSyntax *)0x2:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[6].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (ExternUdpDeclSyntax *)0x3:
    return (PtrTokenOrSyntax *)
           (__index_type *)
           ((long)&__return_storage_ptr__[9].
                   super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
           + 8);
  case (ExternUdpDeclSyntax *)0x4:
    return (PtrTokenOrSyntax *)
           (__index_type *)
           ((long)&__return_storage_ptr__[10].
                   super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
           + 8);
  case (ExternUdpDeclSyntax *)0x5:
    p_Var1 = *(__index_type **)
              ((long)&__return_storage_ptr__[0xb].
                      super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
              + 8);
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)p_Var1;
}

Assistant:

PtrTokenOrSyntax ExternUdpDeclSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &externKeyword;
        case 2: return &actualAttributes;
        case 3: return &primitive;
        case 4: return &name;
        case 5: return portList.get();
        default: return nullptr;
    }
}